

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.c
# Opt level: O1

void bcf_hrec_add_key(bcf_hrec_t *hrec,char *str,int len)

{
  size_t __size;
  char **ppcVar1;
  char *pcVar2;
  long lVar3;
  
  lVar3 = (long)hrec->nkeys;
  hrec->nkeys = hrec->nkeys + 1;
  __size = lVar3 * 8 + 8;
  ppcVar1 = (char **)realloc(hrec->keys,__size);
  hrec->keys = ppcVar1;
  ppcVar1 = (char **)realloc(hrec->vals,__size);
  hrec->vals = ppcVar1;
  if (len != 0) {
    pcVar2 = (char *)malloc((long)(len + 1));
    hrec->keys[lVar3] = pcVar2;
    memcpy(hrec->keys[lVar3],str,(long)len);
    hrec->keys[lVar3][len] = '\0';
    hrec->vals[lVar3] = (char *)0x0;
    return;
  }
  __assert_fail("len",
                "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/vcf.c"
                ,0xdd,"void bcf_hrec_add_key(bcf_hrec_t *, const char *, int)");
}

Assistant:

void bcf_hrec_add_key(bcf_hrec_t *hrec, const char *str, int len)
{
    int n = ++hrec->nkeys;
    hrec->keys = (char**) realloc(hrec->keys, sizeof(char*)*n);
    hrec->vals = (char**) realloc(hrec->vals, sizeof(char*)*n);
    assert( len );
    hrec->keys[n-1] = (char*) malloc((len+1)*sizeof(char));
    memcpy(hrec->keys[n-1],str,len);
    hrec->keys[n-1][len] = 0;
    hrec->vals[n-1] = NULL;
}